

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

int min_monster_difficulty(d_level *dlev)

{
  xchar xVar1;
  
  xVar1 = level_difficulty(dlev);
  return (int)xVar1 / (int)((uint)((u.uevent._1_1_ & 0x20) == 0) * 2 + 4);
}

Assistant:

int min_monster_difficulty(const d_level *dlev)
{
	int zlevel = level_difficulty(dlev);
	if (u.uevent.udemigod) {
	    /* all hell breaks loose */
	    return zlevel / 4;
	} else {
	    return zlevel / 6;
	}
}